

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *rhs)

{
  Ch *pCVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar2;
  size_t sVar3;
  undefined4 uVar4;
  
  pCVar1 = (rhs->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.s.str;
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.n = (rhs->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ).data_.n;
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = pCVar1;
  (rhs->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.f.flags = 0;
  pMVar2 = rhs->ownAllocator_;
  this->allocator_ = rhs->allocator_;
  this->ownAllocator_ = pMVar2;
  internal::Stack<rapidjson::CrtAllocator>::Stack(&this->stack_,&rhs->stack_);
  uVar4 = *(undefined4 *)&(rhs->parseResult_).field_0x4;
  sVar3 = (rhs->parseResult_).offset_;
  (this->parseResult_).code_ = (rhs->parseResult_).code_;
  *(undefined4 *)&(this->parseResult_).field_0x4 = uVar4;
  (this->parseResult_).offset_ = sVar3;
  (rhs->parseResult_).code_ = kParseErrorNone;
  (rhs->parseResult_).offset_ = 0;
  rhs->allocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  rhs->ownAllocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  return;
}

Assistant:

GenericDocument(GenericDocument&& rhs) RAPIDJSON_NOEXCEPT
        : ValueType(std::forward<ValueType>(rhs)), // explicit cast to avoid prohibited move from Document
          allocator_(rhs.allocator_),
          ownAllocator_(rhs.ownAllocator_),
          stack_(std::move(rhs.stack_)),
          parseResult_(rhs.parseResult_)
    {
        rhs.allocator_ = 0;
        rhs.ownAllocator_ = 0;
        rhs.parseResult_ = ParseResult();
    }